

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

bool __thiscall
GlobOpt::ProcessPropOpInTypeCheckSeq<false>
          (GlobOpt *this,Instr *instr,PropertySymOpnd *opnd,BasicBlock *block,
          bool updateExistingValue,bool *emitsTypeCheckOut,bool *changesTypeValueOut,
          bool *isTypeCheckedOut)

{
  GlobOptBlockData *this_00;
  PropertySymOpnd *pPVar1;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  EquivalentTypeSet *right;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  bool bVar5;
  undefined4 *puVar6;
  StackSym *typeSym;
  Value *pVVar7;
  Value *pVVar8;
  JsTypeValueInfo *pJVar9;
  EquivalentTypeSet *pEVar10;
  JITTypeHolder JVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  ushort index;
  JITTypeHolderBase<void> local_58;
  JITTypeHolder opndType;
  uint16 checkedTypeSetIndex;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder valueType;
  uint16 slotIndex;
  bool auxSlot;
  
  if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 4) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x489,"(!opnd->IsTypeDead())","!opnd->IsTypeDead()");
    if (!bVar3) goto LAB_0046f865;
    *puVar6 = 0;
  }
  bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(opnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x48b,"(opnd->IsTypeCheckSeqCandidate())","opnd->IsTypeCheckSeqCandidate()")
    ;
    if (!bVar3) goto LAB_0046f865;
    *puVar6 = 0;
  }
  bVar3 = IR::PropertySymOpnd::HasObjectTypeSym(opnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x48c,"(opnd->HasObjectTypeSym())","opnd->HasObjectTypeSym()");
    if (!bVar3) goto LAB_0046f865;
    *puVar6 = 0;
  }
  if (block == (BasicBlock *)0x0) {
    block = this->currentBlock;
  }
  pPVar1 = (PropertySymOpnd *)instr->m_dst;
  valueType.t._7_1_ = (opnd->field_12).field_0.field_5;
  typeSym = IR::PropertySymOpnd::GetObjectTypeSym(opnd);
  valueType.t._3_1_ = (opnd->field_12).field_0.field_5;
  this_00 = &block->globOptData;
  pVVar7 = GlobOptBlockData::FindObjectTypeValue(this_00,typeSym);
  if (pVVar7 == (Value *)0x0) {
    _checkedTypeSetIndex = (JsTypeValueInfo *)0x0;
  }
  else {
    if ((pVVar7->valueInfo == (ValueInfo *)0x0) ||
       (bVar3 = ValueInfo::IsJsType(pVVar7->valueInfo), !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x4a7,
                         "(valueBefore->GetValueInfo() != nullptr && valueBefore->GetValueInfo()->IsJsType())"
                         ,
                         "valueBefore->GetValueInfo() != nullptr && valueBefore->GetValueInfo()->IsJsType()"
                        );
      if (!bVar3) goto LAB_0046f865;
      *puVar6 = 0;
    }
    _checkedTypeSetIndex = ValueInfo::AsJsType(pVVar7->valueInfo);
  }
  pVVar8 = GlobOptBlockData::FindObjectTypeValue(this_00,typeSym);
  if (pVVar8 == (Value *)0x0) {
    pJVar9 = (JsTypeValueInfo *)0x0;
  }
  else {
    pJVar9 = ValueInfo::AsJsType(pVVar8->valueInfo);
  }
  if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 0x20) != 0) {
    if (emitsTypeCheckOut != (bool *)0x0) {
      *emitsTypeCheckOut = false;
    }
    bVar13 = false;
    bVar3 = false;
    if (changesTypeValueOut == (bool *)0x0) {
      return false;
    }
    goto LAB_0046f851;
  }
  bVar3 = IR::PropertySymOpnd::HasEquivalentTypeSet(opnd);
  if ((!bVar3) || (bVar3 = IR::PropertySymOpnd::NeedsMonoCheck(opnd), bVar3)) {
    bVar3 = IR::PropertySymOpnd::NeedsDepolymorphication(opnd);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x4c5,"(!opnd->NeedsDepolymorphication())",
                         "!opnd->NeedsDepolymorphication()");
      if (!bVar3) goto LAB_0046f865;
      *puVar6 = 0;
    }
    local_58.t = (Type)IR::PropertySymOpnd::GetType(opnd);
    if (pJVar9 != (JsTypeValueInfo *)0x0) {
      local_40.t = (pJVar9->jsType).t;
      opndType.t = (Type)0x0;
      bVar3 = JITTypeHolderBase<void>::operator==(&local_40,&opndType.t);
      if ((!bVar3) || (pJVar9->jsTypeSet != (EquivalentTypeSet *)0x0)) {
        local_40.t = (pJVar9->jsType).t;
        opndType.t = (Type)0x0;
        bVar3 = JITTypeHolderBase<void>::operator!=(&local_40,&opndType.t);
        if (bVar3) {
          local_40.t = (pJVar9->jsType).t;
          bVar3 = JITTypeHolderBase<void>::operator==(&local_40,&local_58);
          if (bVar3) {
            if (isTypeCheckedOut != (bool *)0x0) {
              *isTypeCheckedOut = true;
            }
            bVar12 = false;
            bVar3 = true;
            bVar13 = false;
          }
          else {
            bVar3 = IR::PropertySymOpnd::HasInitialType(opnd);
            if (bVar3) {
              opndType = IR::PropertySymOpnd::GetInitialType(opnd);
              bVar3 = JITTypeHolderBase<void>::operator==(&local_40,&opndType);
              if (bVar3) {
                this_01 = (block->globOptData).maybeWrittenTypeSyms;
                if (this_01 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
                  bVar5 = false;
                }
                else {
                  BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (this_01,(typeSym->super_Sym).m_id);
                  bVar5 = BVar4 != '\0';
                }
                bVar3 = (valueType.t._7_1_ & 4) == 0;
                bVar12 = (bool)(bVar5 & bVar3);
                bVar3 = (bool)(bVar3 | bVar5 ^ 1U);
                bVar13 = bVar3;
                if (isTypeCheckedOut != (bool *)0x0) {
                  *isTypeCheckedOut = (bool)(bVar5 ^ 1U);
                }
                goto LAB_0046f51b;
              }
            }
LAB_0046f3ec:
            bVar12 = false;
            bVar3 = false;
            bVar13 = false;
          }
        }
        else {
          pEVar10 = pJVar9->jsTypeSet;
          if (pEVar10 == (EquivalentTypeSet *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x510,"(valueInfo->GetJsTypeSet())","valueInfo->GetJsTypeSet()");
            if (!bVar3) goto LAB_0046f865;
            *puVar6 = 0;
            pEVar10 = pJVar9->jsTypeSet;
          }
          bVar3 = Js::EquivalentTypeSet::Contains(pEVar10,(JITTypeHolder)local_58.t,(uint16 *)0x0);
          if (bVar3) {
            bVar12 = (valueType.t._7_1_ & 4) == 0;
            bVar3 = bVar12;
            bVar13 = false;
          }
          else {
            bVar3 = IR::PropertySymOpnd::HasInitialType(opnd);
            if (!bVar3) goto LAB_0046f3ec;
            bVar14 = valueType.t._7_1_ & 4;
            JVar11 = IR::PropertySymOpnd::GetInitialType(opnd);
            bVar12 = Js::EquivalentTypeSet::Contains(pEVar10,JVar11,(uint16 *)0x0);
            bVar12 = bVar12 && bVar14 == 0;
            bVar3 = bVar12;
            bVar13 = bVar12;
          }
        }
        goto LAB_0046f51b;
      }
    }
    bVar14 = valueType.t._7_1_ & 4;
    bVar12 = bVar14 == 0;
    IR::PropertySymOpnd::SetTypeAvailable(opnd,false);
    bVar3 = bVar12;
    bVar13 = false;
    if (pPVar1 == opnd && bVar14 == 0) {
      bVar13 = IR::PropertySymOpnd::HasInitialType(opnd);
    }
  }
  else {
    bVar3 = IR::PropertySymOpnd::NeedsMonoCheck(opnd);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x53b,"(!opnd->NeedsMonoCheck())","!opnd->NeedsMonoCheck()");
      if (!bVar3) goto LAB_0046f865;
      *puVar6 = 0;
    }
    pEVar10 = IR::PropertySymOpnd::GetEquivalentTypeSet(opnd);
    opndType.t._0_2_ = 0xffff;
    bVar3 = IR::PropertySymOpnd::NeedsDepolymorphication(opnd);
    if (bVar3) {
      valueType.t._4_2_ = 0xffff;
      valueType.t._6_1_ = 0;
      if (pJVar9 == (JsTypeValueInfo *)0x0) {
LAB_0046f461:
        bVar3 = false;
      }
      else {
        local_58.t = (pJVar9->jsType).t;
        local_40.t = (Type)0x0;
        bVar3 = JITTypeHolderBase<void>::operator!=(&local_58,&local_40.t);
        if (bVar3) {
          IR::PropertySymOpnd::TryDepolymorphication
                    (opnd,(pJVar9->jsType).t,0xffff,false,(uint16 *)((long)&valueType.t + 4),
                     (bool *)((long)&valueType.t + 6),(uint16 *)&opndType);
        }
        else {
          pEVar10 = pJVar9->jsTypeSet;
          if (pEVar10 != (EquivalentTypeSet *)0x0) {
            index = 0;
            do {
              if (pEVar10->count <= index) goto LAB_0046f449;
              JVar11 = Js::EquivalentTypeSet::GetType(pEVar10,index);
              IR::PropertySymOpnd::TryDepolymorphication
                        (opnd,JVar11,valueType.t._4_2_,(bool)valueType.t._6_1_,
                         (uint16 *)((long)&valueType.t + 4),(bool *)((long)&valueType.t + 6),
                         (uint16 *)0x0);
              index = index + 1;
            } while (valueType.t._4_2_ != 0xffff);
            goto LAB_0046f461;
          }
        }
LAB_0046f449:
        if (valueType.t._4_2_ == 0xffff) goto LAB_0046f461;
        bVar3 = true;
        if (isTypeCheckedOut != (bool *)0x0) {
          *isTypeCheckedOut = true;
        }
      }
LAB_0046f464:
      bVar12 = false;
    }
    else if (pJVar9 == (JsTypeValueInfo *)0x0) {
LAB_0046f4ea:
      bVar12 = (valueType.t._7_1_ & 4) == 0;
      bVar3 = bVar12;
    }
    else {
      local_58.t = (pJVar9->jsType).t;
      local_40.t = (Type)0x0;
      bVar3 = JITTypeHolderBase<void>::operator==(&local_58,&local_40.t);
      if ((bVar3) && (pJVar9->jsTypeSet == (EquivalentTypeSet *)0x0)) goto LAB_0046f4ea;
      local_58.t = (pJVar9->jsType).t;
      local_40.t = (Type)0x0;
      bVar3 = JITTypeHolderBase<void>::operator!=(&local_58,&local_40.t);
      if (bVar3) {
        bVar3 = Js::EquivalentTypeSet::Contains(pEVar10,(pJVar9->jsType).t,(uint16 *)&opndType);
      }
      else {
        bVar3 = Js::EquivalentTypeSet::IsSubsetOf(pJVar9->jsTypeSet,pEVar10);
      }
      if (bVar3 != false) {
        if (isTypeCheckedOut != (bool *)0x0) {
          *isTypeCheckedOut = true;
        }
        bVar3 = true;
        if ((uint16)opndType.t != 0xffff) {
          IR::PropertySymOpnd::SetCheckedTypeSetIndex(opnd,(uint16)opndType.t);
        }
        goto LAB_0046f464;
      }
      if (pJVar9->jsTypeSet == (EquivalentTypeSet *)0x0) {
LAB_0046f4f8:
        bVar12 = false;
        bVar3 = false;
      }
      else {
        bVar3 = IR::PropertySymOpnd::IsMono(opnd);
        right = pJVar9->jsTypeSet;
        if (!bVar3) {
          bVar3 = Js::EquivalentTypeSet::IsSubsetOf(pEVar10,right);
          if (bVar3) goto LAB_0046f4ea;
          goto LAB_0046f4f8;
        }
        JVar11 = IR::PropertySymOpnd::GetFirstEquivalentType(opnd);
        bVar13 = Js::EquivalentTypeSet::Contains(right,JVar11,(uint16 *)0x0);
        bVar12 = false;
        bVar3 = false;
        if (bVar13) goto LAB_0046f4ea;
      }
    }
    bVar13 = false;
  }
LAB_0046f51b:
  if ((bVar3 == false) && ((bVar13 | bVar12) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x5d0,"(isSpecialized || (!emitsTypeCheck && !addsProperty))",
                       "isSpecialized || (!emitsTypeCheck && !addsProperty)");
    if (!bVar5) goto LAB_0046f865;
    *puVar6 = 0;
  }
  if (valueType.t._3_1_ != (opnd->field_12).field_0.field_5.typeCheckSeqFlags) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x617,"(typeCheckSeqFlagsBefore == typeCheckSeqFlagsAfter)",
                       "typeCheckSeqFlagsBefore == typeCheckSeqFlagsAfter");
    if (!bVar5) goto LAB_0046f865;
    *puVar6 = 0;
  }
  pVVar8 = GlobOptBlockData::FindObjectTypeValue(this_00,typeSym);
  if (pVVar7 != pVVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x61a,"(valueBefore == valueAfter)","valueBefore == valueAfter");
    if (!bVar5) goto LAB_0046f865;
    *puVar6 = 0;
  }
  if (pVVar8 != (Value *)0x0) {
    if (pVVar7 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x61d,"(valueBefore != nullptr)","valueBefore != nullptr");
      if (!bVar5) goto LAB_0046f865;
      *puVar6 = 0;
    }
    if ((pVVar8->valueInfo == (ValueInfo *)0x0) ||
       (bVar5 = ValueInfo::IsJsType(pVVar8->valueInfo), !bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x61e,
                         "(valueAfter->GetValueInfo() != nullptr && valueAfter->GetValueInfo()->IsJsType())"
                         ,
                         "valueAfter->GetValueInfo() != nullptr && valueAfter->GetValueInfo()->IsJsType()"
                        );
      if (!bVar5) goto LAB_0046f865;
      *puVar6 = 0;
    }
    pJVar9 = ValueInfo::AsJsType(pVVar8->valueInfo);
    if (_checkedTypeSetIndex != pJVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x620,"(valueInfoBefore == valueInfoAfter)",
                         "valueInfoBefore == valueInfoAfter");
      if (!bVar5) goto LAB_0046f865;
      *puVar6 = 0;
    }
    local_58.t = (_checkedTypeSetIndex->jsType).t;
    local_40.t = (pJVar9->jsType).t;
    bVar5 = JITTypeHolderBase<void>::operator==(&local_58,&local_40);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x621,"(valueInfoBefore->GetJsType() == valueInfoAfter->GetJsType())",
                         "valueInfoBefore->GetJsType() == valueInfoAfter->GetJsType()");
      if (!bVar5) goto LAB_0046f865;
      *puVar6 = 0;
    }
    if (_checkedTypeSetIndex->jsTypeSet != pJVar9->jsTypeSet) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x622,
                         "(valueInfoBefore->GetJsTypeSet() == valueInfoAfter->GetJsTypeSet())",
                         "valueInfoBefore->GetJsTypeSet() == valueInfoAfter->GetJsTypeSet()");
      if (!bVar5) {
LAB_0046f865:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  if (emitsTypeCheckOut != (bool *)0x0) {
    *emitsTypeCheckOut = bVar12;
  }
  if (changesTypeValueOut == (bool *)0x0) {
    return bVar3;
  }
  bVar13 = (bool)((bVar13 | bVar12) & bVar3);
LAB_0046f851:
  *changesTypeValueOut = bVar13;
  return bVar3;
}

Assistant:

bool
GlobOpt::ProcessPropOpInTypeCheckSeq(IR::Instr* instr, IR::PropertySymOpnd *opnd, BasicBlock* block, bool updateExistingValue, bool* emitsTypeCheckOut, bool* changesTypeValueOut, bool *isTypeCheckedOut)
{
    // We no longer mark types as dead in the backward pass, so we should never see an instr with a dead type here
    // during the forward pass. For the time being we've retained the logic below to deal with dead types in case
    // we ever wanted to revert back to more aggressive type killing that we had before.
    Assert(!opnd->IsTypeDead());

    Assert(opnd->IsTypeCheckSeqCandidate());
    Assert(opnd->HasObjectTypeSym());

    bool isStore = opnd == instr->GetDst();
    bool isTypeDead = opnd->IsTypeDead();
    bool consumeType = makeChanges && !IsLoopPrePass();
    bool produceType = makeChanges && !isTypeDead;
    bool isSpecialized = false;
    bool emitsTypeCheck = false;
    bool addsProperty = false;

    if (block == nullptr)
    {
        block = this->currentBlock;
    }

    StackSym * typeSym = opnd->GetObjectTypeSym();

#if DBG
    uint16 typeCheckSeqFlagsBefore;
    Value* valueBefore = nullptr;
    JsTypeValueInfo* valueInfoBefore = nullptr;
    if (!makeChanges)
    {
        typeCheckSeqFlagsBefore = opnd->GetTypeCheckSeqFlags();
        valueBefore = block->globOptData.FindObjectTypeValue(typeSym);
        if (valueBefore != nullptr)
        {
            Assert(valueBefore->GetValueInfo() != nullptr && valueBefore->GetValueInfo()->IsJsType());
            valueInfoBefore = valueBefore->GetValueInfo()->AsJsType();
        }
    }
#endif

    Value *value = block->globOptData.FindObjectTypeValue(typeSym);
    JsTypeValueInfo* valueInfo = value != nullptr ? value->GetValueInfo()->AsJsType() : nullptr;

    if (consumeType && valueInfo != nullptr)
    {
        opnd->SetTypeAvailable(true);
    }

    if (opnd->HasTypeMismatch())
    {
        if (emitsTypeCheckOut != nullptr)
        {
            *emitsTypeCheckOut = false;
        }
        if (changesTypeValueOut != nullptr)
        {
            *changesTypeValueOut = false;
        }
        return false;
    }

    bool doEquivTypeCheck = opnd->HasEquivalentTypeSet() && !opnd->NeedsMonoCheck();
    if (!doEquivTypeCheck)
    {
        AssertOrFailFast(!opnd->NeedsDepolymorphication());

        // We need a monomorphic type check here (e.g., final type opt, fixed field check on non-proto property).
        JITTypeHolder opndType = opnd->GetType();

        if (valueInfo == nullptr || (valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr))
        {
            // This is the initial type check.
            opnd->SetTypeAvailable(false);
            isSpecialized = !isTypeDead;
            emitsTypeCheck = isSpecialized;
            addsProperty = isStore && isSpecialized && opnd->HasInitialType();
            if (produceType)
            {
                SetObjectTypeFromTypeSym(typeSym, opndType, nullptr, block, updateExistingValue);
            }
        }
        else if (valueInfo->GetJsType() != nullptr)
        {
            // We have a monomorphic type check upstream. Check against initial/final type.
            const JITTypeHolder valueType(valueInfo->GetJsType());
            if (valueType == opndType)
            {
                // The type on this instruction matches the live value in the value table, so there is no need to
                // refresh the value table.
                isSpecialized = true;
                if (isTypeCheckedOut)
                {
                    *isTypeCheckedOut = true;
                }
                if (consumeType)
                {
                    opnd->SetTypeChecked(true);
                }
            }
            else if (opnd->HasInitialType() && valueType == opnd->GetInitialType())
            {
                // Checked type matches the initial type at this store.
                bool objectMayHaveAcquiredAdditionalProperties =
                    block->globOptData.maybeWrittenTypeSyms &&
                    block->globOptData.maybeWrittenTypeSyms->Test(typeSym->m_id);
                if (consumeType)
                {
                    opnd->SetTypeChecked(!objectMayHaveAcquiredAdditionalProperties);
                    opnd->SetInitialTypeChecked(!objectMayHaveAcquiredAdditionalProperties);
                }
                if (produceType)
                {
                    SetObjectTypeFromTypeSym(typeSym, opndType, nullptr, block, updateExistingValue);
                }
                isSpecialized = !isTypeDead || !objectMayHaveAcquiredAdditionalProperties;
                emitsTypeCheck = isSpecialized && objectMayHaveAcquiredAdditionalProperties;
                addsProperty = isSpecialized;
                if (isTypeCheckedOut)
                {
                    *isTypeCheckedOut = !objectMayHaveAcquiredAdditionalProperties;
                }
            }
            else
            {
                // This must be a type mismatch situation, because the value is available, but doesn't match either
                // the current type or the initial type. We will not optimize this instruction and we do not produce
                // a new type value here.
                isSpecialized = false;

                if (makeChanges)
                {
                    opnd->SetTypeMismatch(true);
                }
            }
        }
        else
        {
            // We have an equivalent type check upstream, but we require a particular type at this point. We
            // can't treat it as "checked", but we may benefit from checking for the required type.
            Assert(valueInfo->GetJsTypeSet());
            Js::EquivalentTypeSet *valueTypeSet = valueInfo->GetJsTypeSet();
            if (valueTypeSet->Contains(opndType))
            {
                // Required type is in the type set we've checked. Check for the required type here, and
                // note in the value info that we've narrowed down to this type. (But leave the type set in the
                // value info so it can be merged with the same type set on other paths.)
                isSpecialized = !isTypeDead;
                emitsTypeCheck = isSpecialized;
                if (produceType)
                {
                    SetSingleTypeOnObjectTypeValue(value, opndType);
                }
            }
            else if (opnd->HasInitialType() && valueTypeSet->Contains(opnd->GetInitialType()))
            {
                // Required initial type is in the type set we've checked. Check for the initial type here, and
                // note in the value info that we've narrowed down to this type. (But leave the type set in the
                // value info so it can be merged with the same type set on other paths.)
                isSpecialized = !isTypeDead;
                emitsTypeCheck = isSpecialized;
                addsProperty = isSpecialized;
                if (produceType)
                {
                    SetSingleTypeOnObjectTypeValue(value, opndType);
                }
            }
            else
            {
                // This must be a type mismatch situation, because the value is available, but doesn't match either
                // the current type or the initial type. We will not optimize this instruction and we do not produce
                // a new type value here.
                isSpecialized = false;

                if (makeChanges)
                {
                    opnd->SetTypeMismatch(true);
                }
            }
        }
    }
    else
    {
        Assert(!opnd->NeedsMonoCheck());

        Js::EquivalentTypeSet * opndTypeSet = opnd->GetEquivalentTypeSet();
        uint16 checkedTypeSetIndex = (uint16)-1;

        if (opnd->NeedsDepolymorphication())
        {
            // The opnd's type set (opndTypeSet) is non-equivalent. Test all the types coming from the valueInfo.
            // If all of them are contained in opndTypeSet, and all of them have the same slot index in opnd's
            // objtypespecfldinfo, then we can use that slot index and treat the set as equivalent.
            // (Also test whether all types do/don't use aux slots.)

            uint16 slotIndex = Js::Constants::NoSlot;
            bool auxSlot = false;

            // Do this work only if there is an upstream type value. We don't attempt to do a type check based on
            // a non-equivalent set.
            if (valueInfo != nullptr)
            {
                if (valueInfo->GetJsType() != nullptr)
                {
                    opnd->TryDepolymorphication(valueInfo->GetJsType(), Js::Constants::NoSlot, false, &slotIndex, &auxSlot, &checkedTypeSetIndex);
                }
                else if (valueInfo->GetJsTypeSet() != nullptr)
                {
                    Js::EquivalentTypeSet *typeSet = valueInfo->GetJsTypeSet();
                    for (uint16 i = 0; i < typeSet->GetCount(); i++)
                    {
                        opnd->TryDepolymorphication(typeSet->GetType(i), slotIndex, auxSlot, &slotIndex, &auxSlot);
                        if (slotIndex == Js::Constants::NoSlot)
                        {
                            // Indicates failure/mismatch. We're done.
                            break;
                        }
                    }
                }
            }

            if (slotIndex == Js::Constants::NoSlot)
            {
                // Indicates failure/mismatch
                isSpecialized = false;
                if (makeChanges)
                {
                    opnd->SetTypeMismatch(true);
                }
            }
            else
            {
                // Indicates we can optimize, as all upstream types are equivalent here.

                isSpecialized = true;
                if (isTypeCheckedOut)
                {
                    *isTypeCheckedOut = true;
                }
                if (consumeType)
                {
                    opnd->SetTypeChecked(true);

                    opnd->SetSlotIndex(slotIndex);
                    opnd->SetUsesAuxSlot(auxSlot);

                    opnd->GetObjTypeSpecInfo()->SetSlotIndex(slotIndex);
                    opnd->GetObjTypeSpecInfo()->SetUsesAuxSlot(auxSlot);

                    if (checkedTypeSetIndex != (uint16)-1)
                    {
                        opnd->SetCheckedTypeSetIndex(checkedTypeSetIndex);
                    }
                }
            }
        }
        else if (valueInfo == nullptr || (valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr))
        {
            // If we don't have a value for the type we will have to emit a type check and we produce a new type value here.
            if (produceType)
            {
                if (opnd->IsMono())
                {
                    SetObjectTypeFromTypeSym(typeSym, opnd->GetFirstEquivalentType(), nullptr, block, updateExistingValue);
                }
                else
                {
                    SetObjectTypeFromTypeSym(typeSym, nullptr, opndTypeSet, block, updateExistingValue);
                }
            }
            isSpecialized = !isTypeDead;
            emitsTypeCheck = isSpecialized;
        }
        else if (valueInfo->GetJsType() != nullptr ?
                 opndTypeSet->Contains(valueInfo->GetJsType(), &checkedTypeSetIndex) :
                 IsSubsetOf(valueInfo->GetJsTypeSet(), opndTypeSet))
        {
            // All the types in the value info are contained in the set required by this access,
            // meaning that they're equivalent to the opnd's type set.
            // We won't have a type check, and we don't need to touch the type value.
            isSpecialized = true;
            if (isTypeCheckedOut)
            {
                *isTypeCheckedOut = true;
            }
            if (consumeType)
            {
                opnd->SetTypeChecked(true);
            }
            if (checkedTypeSetIndex != (uint16)-1)
            {
                opnd->SetCheckedTypeSetIndex(checkedTypeSetIndex);
            }
        }
        else if (valueInfo->GetJsTypeSet() &&
                 (opnd->IsMono() ?
                      valueInfo->GetJsTypeSet()->Contains(opnd->GetFirstEquivalentType()) :
                      IsSubsetOf(opndTypeSet, valueInfo->GetJsTypeSet())
                 )
            )
        {
            // We have an equivalent type check upstream, but we require a tighter type check at this point.
            // We can't treat the operand as "checked", but check for equivalence with the tighter set and update the
            // value info.
            if (produceType)
            {
                if (opnd->IsMono())
                {
                    SetObjectTypeFromTypeSym(typeSym, opnd->GetFirstEquivalentType(), nullptr, block, updateExistingValue);
                }
                else
                {
                    SetObjectTypeFromTypeSym(typeSym, nullptr, opndTypeSet, block, updateExistingValue);
                }
            }
            isSpecialized = !isTypeDead;
            emitsTypeCheck = isSpecialized;
        }
        else
        {
            // This must be a type mismatch situation, because the value is available, but doesn't match either
            // the current type or the initial type. We will not optimize this instruction and we do not produce
            // a new type value here.
            isSpecialized = false;

            if (makeChanges)
            {
                opnd->SetTypeMismatch(true);
            }
        }
    }

    Assert(isSpecialized || (!emitsTypeCheck && !addsProperty));

    if (consumeType && opnd->MayNeedWriteGuardProtection())
    {
        Assert(!isStore);
        PropertySym *propertySym = opnd->m_sym->AsPropertySym();
        Assert(propertySym->m_writeGuardSym);
        opnd->SetWriteGuardChecked(!!block->globOptData.liveFields->Test(propertySym->m_writeGuardSym->m_id));
    }

    // Even specialized property adds must kill all types for other property adds. That's because any other object sym
    // may, in fact, be an alias of the instance whose type is being modified here. (see Windows Blue Bug 541876)
    if (makeChanges && addsProperty)
    {
        Assert(isStore && isSpecialized);
        Assert(this->objectTypeSyms != nullptr);
        Assert(this->objectTypeSyms->Test(typeSym->m_id));

        if (block->globOptData.maybeWrittenTypeSyms == nullptr)
        {
            block->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
        }

        this->objectTypeSyms->Clear(typeSym->m_id);
        block->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
        this->objectTypeSyms->Set(typeSym->m_id);
    }

    if (produceType && emitsTypeCheck && opnd->IsMono())
    {
        // Consider (ObjTypeSpec): Represent maybeWrittenTypeSyms as a flag on value info of the type sym.
        if (block->globOptData.maybeWrittenTypeSyms != nullptr)
        {
            // We're doing a type check here, so objtypespec of property adds is safe for this type
            // from this point forward.
            block->globOptData.maybeWrittenTypeSyms->Clear(typeSym->m_id);
        }
    }

    // Consider (ObjTypeSpec): Enable setting write guards live on instructions hoisted out of loops. Note that produceType
    // is false if the type values on loop back edges don't match (see earlier comments).
    // This means that hoisted instructions won't set write guards live if the type changes in the loop, even if
    // the corresponding properties have not been written inside the loop. This may result in some unnecessary type
    // checks and bailouts inside the loop. To enable this, we would need to verify the write guards are still live
    // on the back edge (much like we're doing for types above).

    // Consider (ObjTypeSpec): Support polymorphic write guards as well. We can't currently distinguish between mono and
    // poly write guards, and a type check can only protect operations matching with respect to polymorphism (see
    // BackwardPass::TrackObjTypeSpecProperties for details), so for now we only target monomorphic operations.
    if (produceType && emitsTypeCheck && opnd->IsMono())
    {
        // If the type check we'll emit here protects some property operations that require a write guard (i.e.
        // they must do an extra type check and property guard check, if they have been written to in this
        // function), let's mark the write guards as live here, so we can accurately track if their properties
        // have been written to. Make sure we only set those that we'll actually guard, i.e. those that match
        // with respect to polymorphism.
        if (opnd->GetWriteGuards() != nullptr)
        {
            block->globOptData.liveFields->Or(opnd->GetWriteGuards());
        }
    }

    if (makeChanges && isTypeDead)
    {
        this->KillObjectType(opnd->GetObjectSym(), block->globOptData.liveFields);
    }

#if DBG
    if (!makeChanges)
    {
        uint16 typeCheckSeqFlagsAfter = opnd->GetTypeCheckSeqFlags();
        Assert(typeCheckSeqFlagsBefore == typeCheckSeqFlagsAfter);

        Value* valueAfter = block->globOptData.FindObjectTypeValue(typeSym);
        Assert(valueBefore == valueAfter);
        if (valueAfter != nullptr)
        {
            Assert(valueBefore != nullptr);
            Assert(valueAfter->GetValueInfo() != nullptr && valueAfter->GetValueInfo()->IsJsType());
            JsTypeValueInfo* valueInfoAfter = valueAfter->GetValueInfo()->AsJsType();
            Assert(valueInfoBefore == valueInfoAfter);
            Assert(valueInfoBefore->GetJsType() == valueInfoAfter->GetJsType());
            Assert(valueInfoBefore->GetJsTypeSet() == valueInfoAfter->GetJsTypeSet());
        }
    }
#endif

    if (emitsTypeCheckOut != nullptr)
    {
        *emitsTypeCheckOut = emitsTypeCheck;
    }

    if (changesTypeValueOut != nullptr)
    {
        *changesTypeValueOut = isSpecialized && (emitsTypeCheck || addsProperty);
    }

    if (makeChanges)
    {
        // Track liveness of aux slot ptr syms.
        if (!PHASE_OFF(Js::ReuseAuxSlotPtrPhase, this->func) && isSpecialized)
        {
            if (opnd->UsesAuxSlot() && !opnd->IsLoadedFromProto())
            {
                // Optimized ld/st that loads/uses an aux slot ptr.
                // Aux slot sym is live forward.
                StackSym *auxSlotPtrSym = this->EnsureAuxSlotPtrSym(opnd);
                if (!this->IsLoopPrePass() && opnd->IsTypeChecked())
                {
                    if (block->globOptData.liveFields->TestAndSet(auxSlotPtrSym->m_id))
                    {
                        // Aux slot sym is available here. Tell lowerer to use it.
                        opnd->SetAuxSlotPtrSymAvailable(true);
                    }
                }
                else
                {
                    block->globOptData.liveFields->Set(auxSlotPtrSym->m_id);
                }
            }
            else if (!opnd->IsTypeChecked())
            {
                // Type sym is not available here (i.e., object shape is not known) and we're not loading the aux slots.
                // May get here with aux slot sym still in live set if type sym is not in the value table.
                // Clear the aux slot sym out of the live set.
                StackSym *auxSlotPtrSym = opnd->GetAuxSlotPtrSym();
                if (auxSlotPtrSym)
                {
                    block->globOptData.liveFields->Clear(auxSlotPtrSym->m_id);
                }
            }
        }
    }

    return isSpecialized;
}